

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::_List_iterator<State>_>::copyAppend
          (QGenericArrayOps<std::_List_iterator<State>_> *this,_List_iterator<State> *b,
          _List_iterator<State> *e)

{
  _List_iterator<State> *p_Var1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  _List_iterator<State> *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    p_Var1 = QArrayDataPointer<std::_List_iterator<State>_>::begin
                       ((QArrayDataPointer<std::_List_iterator<State>_> *)0x134597);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      p_Var1[*(long *)(in_RDI + 0x10)]._M_node = (_List_node_base *)*local_10;
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }